

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppnet.cpp
# Opt level: O0

void __thiscall cppnet::CppNet::Init(CppNet *this,int32_t thread_num)

{
  bool bVar1;
  element_type *this_00;
  SingletonLogger *this_01;
  shared_ptr<cppnet::CppNetBase> local_28;
  uint32_t local_14;
  CppNet *pCStack_10;
  int32_t thread_num_local;
  CppNet *this_local;
  
  local_14 = thread_num;
  pCStack_10 = this;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)this);
  if (!bVar1) {
    std::make_shared<cppnet::CppNetBase>();
    std::shared_ptr<cppnet::CppNetBase>::operator=(&this->_cppnet_base,&local_28);
    std::shared_ptr<cppnet::CppNetBase>::~shared_ptr(&local_28);
    this_00 = std::__shared_ptr_access<cppnet::CppNetBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<cppnet::CppNetBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)this);
    CppNetBase::Init(this_00,local_14);
    this_01 = Singleton<cppnet::SingletonLogger>::Instance();
    SingletonLogger::SetLevel(this_01,LL_NULL);
  }
  return;
}

Assistant:

void CppNet::Init(int32_t thread_num) {
    if (!_cppnet_base) {
        _cppnet_base = std::make_shared<CppNetBase>();

    } else {
        return;
    }
    
    _cppnet_base->Init(thread_num);
    if (__print_log) {
        std::shared_ptr<Logger> file_log = std::make_shared<FileLogger>(__log_file_name);
        std::shared_ptr<Logger> std_log = std::make_shared<StdoutLogger>();
        file_log->SetLogger(std_log);
        LOG_SET(file_log);
        LOG_SET_LEVEL((LogLevel)__log_level);
    } else {
        LOG_SET_LEVEL(LL_NULL);
    }
}